

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButtonPrivate::moveFocus(QAbstractButtonPrivate *this,int key)

{
  QWidget *this_00;
  long lVar1;
  FocusPolicy FVar2;
  bool bVar3;
  FocusPolicy FVar4;
  QWidget *this_01;
  long lVar5;
  long lVar6;
  QWidget *pQVar7;
  QWidget *pQVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  byte bVar14;
  int i;
  undefined1 *puVar15;
  long in_FS_OFFSET;
  bool bVar16;
  QRect QVar17;
  QRect QVar18;
  int local_c4;
  QWidget *local_c0;
  int local_b8;
  int local_b0;
  Representation local_a0;
  Representation local_98;
  QPoint local_80;
  QPoint local_78;
  QRect local_70;
  QAbstractButton *fb;
  QArrayDataPointer<QAbstractButton_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  queryButtonList((QList<QAbstractButton_*> *)&local_58,this);
  if (this->group == (QButtonGroup *)0x0) {
    bVar14 = (byte)this->field_0x28c >> 3 & 1;
  }
  else {
    bVar14 = *(byte *)(*(long *)&this->group->field_0x8 + 0xa0);
  }
  this_01 = QApplication::focusWidget();
  fb = QtPrivate::qobject_cast_helper<QAbstractButton*,QObject>(&this_01->super_QObject);
  if ((fb != (QAbstractButton *)0x0) &&
     (bVar3 = QListSpecialMethodsBase<QAbstractButton*>::contains<QAbstractButton*>
                        ((QListSpecialMethodsBase<QAbstractButton*> *)&local_58,&fb), bVar3)) {
    local_70 = QWidget::rect(this_01);
    local_80.xp.m_i = 0;
    local_80.yp.m_i = 0;
    local_78 = QWidget::mapToGlobal(this_01,&local_80);
    QVar17 = QRect::translated(&local_70,&local_78);
    lVar5 = ((long)QVar17.x2.m_i.m_i + (long)QVar17.x1.m_i.m_i) / 2;
    lVar6 = ((QVar17._8_8_ >> 0x20) + (QVar17._0_8_ >> 0x20)) / 2;
    bVar3 = qt_tab_all_widgets();
    FVar2 = ~StrongFocus;
    if (bVar3) {
      FVar2 = ~TabFocus;
    }
    local_c4 = -1;
    local_c0 = (QWidget *)0x0;
    for (puVar15 = (undefined1 *)0x0; puVar15 < (ulong)local_58.size; puVar15 = puVar15 + 1) {
      this_00 = &local_58.ptr[(long)puVar15]->super_QWidget;
      if (this_00 == this_01) goto switchD_0039b3ee_default;
      pQVar7 = QWidget::window(this_00);
      pQVar8 = QWidget::window(this_01);
      if (((pQVar7 != pQVar8) || ((this_00->data->widget_attributes & 0x10001) != 0)) ||
         ((bVar14 == 0 && (FVar4 = QWidget::focusPolicy(this_00), (FVar4 | FVar2) != ~NoFocus))))
      goto switchD_0039b3ee_default;
      local_70 = QWidget::rect(this_00);
      local_80.xp.m_i = 0;
      local_80.yp.m_i = 0;
      local_78 = QWidget::mapToGlobal(this_00,&local_80);
      QVar18 = QRect::translated(&local_70,&local_78);
      lVar9 = ((long)QVar18.x2.m_i.m_i + (long)QVar18.x1.m_i.m_i) / 2;
      lVar10 = ((QVar18._8_8_ >> 0x20) + (QVar18._0_8_ >> 0x20)) / 2;
      iVar11 = (int)lVar10;
      iVar13 = (int)lVar9;
      local_b8 = (int)lVar6;
      local_b0 = (int)lVar5;
      if ((QVar17.x1.m_i.m_i < QVar18.x2.m_i.m_i && QVar18.x1.m_i.m_i < QVar17.x2.m_i.m_i) &&
         ((key == 0x1000015 || (key == 0x1000013)))) {
        iVar11 = iVar11 - local_b8;
        iVar12 = -iVar11;
        if (0 < iVar11) {
          iVar12 = iVar11;
        }
        iVar13 = iVar13 - local_b0;
LAB_0039b380:
        iVar11 = -iVar13;
        if (0 < iVar13) {
          iVar11 = iVar13;
        }
        iVar11 = iVar11 + iVar12 * 0x10000;
      }
      else {
        local_98 = QVar17.y2.m_i;
        if (((QVar18.y1.m_i.m_i < local_98.m_i) &&
            (local_a0 = QVar17.y1.m_i, local_a0.m_i < QVar18.y2.m_i.m_i)) &&
           ((key == 0x1000014 || (key == 0x1000012)))) {
          iVar13 = iVar13 - local_b0;
          iVar12 = -iVar13;
          if (0 < iVar13) {
            iVar12 = iVar13;
          }
          iVar13 = iVar11 - local_b8;
          goto LAB_0039b380;
        }
        iVar11 = (iVar11 - local_b8) * (iVar11 - local_b8) +
                 (iVar13 - local_b0) * (iVar13 - local_b0) + 0x40000000;
      }
      if ((local_c4 < iVar11) && (local_c0 != (QWidget *)0x0)) goto switchD_0039b3ee_default;
      switch(key) {
      case 0x1000012:
        bVar3 = SBORROW8(lVar9,lVar5);
        lVar10 = lVar9 - lVar5;
        break;
      case 0x1000013:
        bVar3 = SBORROW8(lVar10,lVar6);
        lVar10 = lVar10 - lVar6;
        break;
      case 0x1000014:
        bVar16 = SBORROW8(lVar9,lVar5);
        lVar1 = lVar9 - lVar5;
        bVar3 = lVar9 == lVar5;
        goto LAB_0039b404;
      case 0x1000015:
        bVar16 = SBORROW8(lVar10,lVar6);
        lVar1 = lVar10 - lVar6;
        bVar3 = lVar10 == lVar6;
LAB_0039b404:
        if (!bVar3 && bVar16 == lVar1 < 0) {
          local_c4 = iVar11;
          local_c0 = this_00;
        }
      default:
        goto switchD_0039b3ee_default;
      }
      if (bVar3 != lVar10 < 0) {
        local_c4 = iVar11;
        local_c0 = this_00;
      }
switchD_0039b3ee_default:
    }
    if ((bVar14 == 0) || (local_c0 == (QWidget *)0x0)) {
      if (local_c0 == (QWidget *)0x0) goto LAB_0039b493;
    }
    else if (((*(byte *)(*(long *)&(fb->super_QWidget).field_0x8 + 0x28c) & 2) != 0) &&
            ((*(byte *)(*(long *)&local_c0->field_0x8 + 0x28c) & 1) != 0)) {
      QAbstractButton::click((QAbstractButton *)local_c0);
    }
    QWidget::setFocus(local_c0,((key & 0xfffffffeU) == 0x1000012) + TabFocusReason);
  }
LAB_0039b493:
  QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButtonPrivate::moveFocus(int key)
{
    QList<QAbstractButton *> buttonList = queryButtonList();
#if QT_CONFIG(buttongroup)
    bool exclusive = group ? group->d_func()->exclusive : autoExclusive;
#else
    bool exclusive = autoExclusive;
#endif
    QWidget *f = QApplication::focusWidget();
    QAbstractButton *fb = qobject_cast<QAbstractButton *>(f);
    if (!fb || !buttonList.contains(fb))
        return;

    QAbstractButton *candidate = nullptr;
    int bestScore = -1;
    QRect target = f->rect().translated(f->mapToGlobal(QPoint(0,0)));
    QPoint goal = target.center();
    uint focus_flag = qt_tab_all_widgets() ? Qt::TabFocus : Qt::StrongFocus;

    for (int i = 0; i < buttonList.size(); ++i) {
        QAbstractButton *button = buttonList.at(i);
        if (button != f && button->window() == f->window() && button->isEnabled() && !button->isHidden() &&
            (exclusive || (button->focusPolicy() & focus_flag) == focus_flag)) {
            QRect buttonRect = button->rect().translated(button->mapToGlobal(QPoint(0,0)));
            QPoint p = buttonRect.center();

            //Priority to widgets that overlap on the same coordinate.
            //In that case, the distance in the direction will be used as significant score,
            //take also in account orthogonal distance in case two widget are in the same distance.
            int score;
            if ((buttonRect.x() < target.right() && target.x() < buttonRect.right())
                  && (key == Qt::Key_Up || key == Qt::Key_Down)) {
                //one item's is at the vertical of the other
                score = (qAbs(p.y() - goal.y()) << 16) + qAbs(p.x() - goal.x());
            } else if ((buttonRect.y() < target.bottom() && target.y() < buttonRect.bottom())
                        && (key == Qt::Key_Left || key == Qt::Key_Right) ) {
                //one item's is at the horizontal of the other
                score = (qAbs(p.x() - goal.x()) << 16) + qAbs(p.y() - goal.y());
            } else {
                score = (1 << 30) + (p.y() - goal.y()) * (p.y() - goal.y()) + (p.x() - goal.x()) * (p.x() - goal.x());
            }

            if (score > bestScore && candidate)
                continue;

            switch(key) {
            case Qt::Key_Up:
                if (p.y() < goal.y()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Down:
                if (p.y() > goal.y()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Left:
                if (p.x() < goal.x()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Right:
                if (p.x() > goal.x()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            }
        }
    }

    if (exclusive
#ifdef QT_KEYPAD_NAVIGATION
        && !QApplicationPrivate::keypadNavigationEnabled()
#endif
        && candidate
        && fb->d_func()->checked
        && candidate->d_func()->checkable)
        candidate->click();

    if (candidate) {
        if (key == Qt::Key_Up || key == Qt::Key_Left)
            candidate->setFocus(Qt::BacktabFocusReason);
        else
            candidate->setFocus(Qt::TabFocusReason);
    }
}